

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void R_CheckDrawSegs(void)

{
  long lVar1;
  size_t local_20;
  ptrdiff_t firstofs;
  size_t newdrawsegs;
  
  if (ds_p == drawsegs + MaxDrawSegs) {
    if (MaxDrawSegs == 0) {
      local_20 = 0x20;
    }
    else {
      local_20 = MaxDrawSegs << 1;
    }
    lVar1 = (long)firstdrawseg - (long)drawsegs;
    drawsegs = (drawseg_t *)
               M_Realloc_Dbg(drawsegs,local_20 * 0x98,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                             ,0x924);
    firstdrawseg = drawsegs + lVar1 / 0x98;
    ds_p = drawsegs + MaxDrawSegs;
    MaxDrawSegs = local_20;
    DPrintf(3,"MaxDrawSegs increased to %zu\n",local_20);
  }
  return;
}

Assistant:

void R_CheckDrawSegs ()
{
	if (ds_p == &drawsegs[MaxDrawSegs])
	{ // [RH] Grab some more drawsegs
		size_t newdrawsegs = MaxDrawSegs ? MaxDrawSegs*2 : 32;
		ptrdiff_t firstofs = firstdrawseg - drawsegs;
		drawsegs = (drawseg_t *)M_Realloc (drawsegs, newdrawsegs * sizeof(drawseg_t));
		firstdrawseg = drawsegs + firstofs;
		ds_p = drawsegs + MaxDrawSegs;
		MaxDrawSegs = newdrawsegs;
		DPrintf (DMSG_NOTIFY, "MaxDrawSegs increased to %zu\n", MaxDrawSegs);
	}
}